

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LedgerFormats.cpp
# Opt level: O0

void __thiscall jbcoin::LedgerFormats::LedgerFormats(LedgerFormats *this)

{
  Item *pIVar1;
  SOElement local_5d0;
  SOElement local_5c0;
  SOElement local_5b0;
  SOElement local_5a0;
  SOElement local_590;
  SOElement local_580;
  SOElement local_570;
  SOElement local_560;
  SOElement local_550;
  SOElement local_540;
  SOElement local_530;
  SOElement local_520;
  SOElement local_510;
  SOElement local_500;
  SOElement local_4f0;
  SOElement local_4e0;
  SOElement local_4d0;
  SOElement local_4c0;
  SOElement local_4b0;
  SOElement local_4a0;
  SOElement local_490;
  SOElement local_480;
  SOElement local_470;
  SOElement local_460;
  SOElement local_450;
  SOElement local_440;
  SOElement local_430;
  SOElement local_420;
  SOElement local_410;
  SOElement local_400;
  SOElement local_3f0;
  SOElement local_3e0;
  SOElement local_3d0;
  SOElement local_3c0;
  SOElement local_3b0;
  SOElement local_3a0;
  SOElement local_390;
  SOElement local_380;
  SOElement local_370;
  SOElement local_360;
  SOElement local_350;
  SOElement local_340;
  SOElement local_330;
  SOElement local_320;
  SOElement local_310;
  SOElement local_300;
  SOElement local_2f0;
  SOElement local_2e0;
  SOElement local_2d0;
  SOElement local_2c0;
  SOElement local_2b0;
  SOElement local_2a0;
  SOElement local_290;
  SOElement local_280;
  SOElement local_270;
  SOElement local_260;
  SOElement local_250;
  SOElement local_240;
  SOElement local_230;
  SOElement local_220;
  SOElement local_210;
  SOElement local_200;
  SOElement local_1f0;
  SOElement local_1e0;
  SOElement local_1d0;
  SOElement local_1c0;
  SOElement local_1b0;
  SOElement local_1a0;
  SOElement local_190;
  SOElement local_180;
  SOElement local_170;
  SOElement local_160;
  SOElement local_150;
  SOElement local_140;
  SOElement local_130;
  SOElement local_120;
  SOElement local_110;
  SOElement local_100;
  SOElement local_f0;
  SOElement local_e0;
  SOElement local_d0;
  SOElement local_c0;
  SOElement local_b0;
  SOElement local_a0;
  SOElement local_90;
  SOElement local_80;
  SOElement local_70;
  SOElement local_60;
  SOElement local_50;
  SOElement local_40;
  SOElement local_30 [2];
  LedgerFormats *local_10;
  LedgerFormats *this_local;
  
  local_10 = this;
  KnownFormats<jbcoin::LedgerEntryType>::KnownFormats
            (&this->super_KnownFormats<jbcoin::LedgerEntryType>);
  (this->super_KnownFormats<jbcoin::LedgerEntryType>)._vptr_KnownFormats =
       (_func_int **)&PTR_addCommonFields_00519d28;
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"AccountRoot",
                      ltACCOUNT_ROOT);
  SOElement::SOElement(local_30,(SField *)sfAccount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,local_30);
  SOElement::SOElement(&local_40,(SField *)sfSequence,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_40);
  SOElement::SOElement(&local_50,(SField *)sfBalance,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_50);
  SOElement::SOElement(&local_60,(SField *)sfOwnerCount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_60);
  SOElement::SOElement(&local_70,(SField *)sfPreviousTxnID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_70);
  SOElement::SOElement(&local_80,(SField *)sfPreviousTxnLgrSeq,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_80);
  SOElement::SOElement(&local_90,(SField *)sfAccountTxnID,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_90);
  SOElement::SOElement(&local_a0,(SField *)sfRegularKey,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_a0);
  SOElement::SOElement(&local_b0,(SField *)sfEmailHash,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_b0);
  SOElement::SOElement(&local_c0,(SField *)sfWalletLocator,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_c0);
  SOElement::SOElement(&local_d0,(SField *)sfWalletSize,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_d0);
  SOElement::SOElement(&local_e0,(SField *)sfMessageKey,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_e0);
  SOElement::SOElement(&local_f0,(SField *)sfTransferRate,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_f0);
  SOElement::SOElement(&local_100,(SField *)sfDomain,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_100);
  SOElement::SOElement(&local_110,(SField *)sfTickSize,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_110);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"DirectoryNode",ltDIR_NODE)
  ;
  SOElement::SOElement(&local_120,(SField *)sfOwner,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_120);
  SOElement::SOElement(&local_130,(SField *)sfTakerPaysCurrency,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_130);
  SOElement::SOElement(&local_140,(SField *)sfTakerPaysIssuer,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_140);
  SOElement::SOElement(&local_150,(SField *)sfTakerGetsCurrency,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_150);
  SOElement::SOElement(&local_160,(SField *)sfTakerGetsIssuer,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_160);
  SOElement::SOElement(&local_170,(SField *)sfExchangeRate,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_170);
  SOElement::SOElement(&local_180,(SField *)sfIndexes,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_180);
  SOElement::SOElement(&local_190,(SField *)sfRootIndex,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_190);
  SOElement::SOElement(&local_1a0,(SField *)sfIndexNext,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_1a0);
  SOElement::SOElement(&local_1b0,(SField *)sfIndexPrevious,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_1b0);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Offer",ltOFFER);
  SOElement::SOElement(&local_1c0,(SField *)sfAccount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_1c0);
  SOElement::SOElement(&local_1d0,(SField *)sfSequence,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_1d0);
  SOElement::SOElement(&local_1e0,(SField *)sfTakerPays,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_1e0);
  SOElement::SOElement(&local_1f0,(SField *)sfTakerGets,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_1f0);
  SOElement::SOElement(&local_200,(SField *)sfBookDirectory,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_200);
  SOElement::SOElement(&local_210,(SField *)sfBookNode,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_210);
  SOElement::SOElement(&local_220,(SField *)sfOwnerNode,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_220);
  SOElement::SOElement(&local_230,(SField *)sfPreviousTxnID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_230);
  SOElement::SOElement(&local_240,(SField *)sfPreviousTxnLgrSeq,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_240);
  SOElement::SOElement(&local_250,(SField *)sfExpiration,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_250);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"JbcoinState",
                      ltJBCOIN_STATE);
  SOElement::SOElement(&local_260,(SField *)sfBalance,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_260);
  SOElement::SOElement(&local_270,(SField *)sfLowLimit,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_270);
  SOElement::SOElement(&local_280,(SField *)sfHighLimit,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_280);
  SOElement::SOElement(&local_290,(SField *)sfPreviousTxnID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_290);
  SOElement::SOElement(&local_2a0,(SField *)sfPreviousTxnLgrSeq,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_2a0);
  SOElement::SOElement(&local_2b0,(SField *)sfLowNode,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_2b0);
  SOElement::SOElement(&local_2c0,(SField *)sfLowQualityIn,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_2c0);
  SOElement::SOElement(&local_2d0,(SField *)sfLowQualityOut,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_2d0);
  SOElement::SOElement(&local_2e0,(SField *)sfHighNode,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_2e0);
  SOElement::SOElement(&local_2f0,(SField *)sfHighQualityIn,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_2f0);
  SOElement::SOElement(&local_300,(SField *)sfHighQualityOut,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_300);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Escrow",ltESCROW);
  SOElement::SOElement(&local_310,(SField *)sfAccount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_310);
  SOElement::SOElement(&local_320,(SField *)sfDestination,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_320);
  SOElement::SOElement(&local_330,(SField *)sfAmount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_330);
  SOElement::SOElement(&local_340,(SField *)sfCondition,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_340);
  SOElement::SOElement(&local_350,(SField *)sfCancelAfter,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_350);
  SOElement::SOElement(&local_360,(SField *)sfFinishAfter,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_360);
  SOElement::SOElement(&local_370,(SField *)sfSourceTag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_370);
  SOElement::SOElement(&local_380,(SField *)sfDestinationTag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_380);
  SOElement::SOElement(&local_390,(SField *)sfOwnerNode,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_390);
  SOElement::SOElement(&local_3a0,(SField *)sfPreviousTxnID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_3a0);
  SOElement::SOElement(&local_3b0,(SField *)sfPreviousTxnLgrSeq,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_3b0);
  SOElement::SOElement(&local_3c0,(SField *)sfDestinationNode,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_3c0);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"LedgerHashes",
                      ltLEDGER_HASHES);
  SOElement::SOElement(&local_3d0,(SField *)sfFirstLedgerSequence,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_3d0);
  SOElement::SOElement(&local_3e0,(SField *)sfLastLedgerSequence,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_3e0);
  SOElement::SOElement(&local_3f0,(SField *)sfHashes,SOE_REQUIRED);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_3f0);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Amendments",ltAMENDMENTS);
  SOElement::SOElement(&local_400,(SField *)sfAmendments,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_400);
  SOElement::SOElement(&local_410,(SField *)sfMajorities,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_410);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"FeeSettings",
                      ltFEE_SETTINGS);
  SOElement::SOElement(&local_420,(SField *)sfBaseFee,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_420);
  SOElement::SOElement(&local_430,(SField *)sfReferenceFeeUnits,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_430);
  SOElement::SOElement(&local_440,(SField *)sfReserveBase,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_440);
  SOElement::SOElement(&local_450,(SField *)sfReserveIncrement,SOE_REQUIRED);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_450);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Ticket",ltTICKET);
  SOElement::SOElement(&local_460,(SField *)sfAccount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_460);
  SOElement::SOElement(&local_470,(SField *)sfSequence,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_470);
  SOElement::SOElement(&local_480,(SField *)sfOwnerNode,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_480);
  SOElement::SOElement(&local_490,(SField *)sfTarget,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_490);
  SOElement::SOElement(&local_4a0,(SField *)sfExpiration,SOE_OPTIONAL);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_4a0);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"SignerList",ltSIGNER_LIST)
  ;
  SOElement::SOElement(&local_4b0,(SField *)sfOwnerNode,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_4b0);
  SOElement::SOElement(&local_4c0,(SField *)sfSignerQuorum,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_4c0);
  SOElement::SOElement(&local_4d0,(SField *)sfSignerEntries,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_4d0);
  SOElement::SOElement(&local_4e0,(SField *)sfSignerListID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_4e0);
  SOElement::SOElement(&local_4f0,(SField *)sfPreviousTxnID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_4f0);
  SOElement::SOElement(&local_500,(SField *)sfPreviousTxnLgrSeq,SOE_REQUIRED);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_500);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"PayChannel",ltPAYCHAN);
  SOElement::SOElement(&local_510,(SField *)sfAccount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_510);
  SOElement::SOElement(&local_520,(SField *)sfDestination,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_520);
  SOElement::SOElement(&local_530,(SField *)sfAmount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_530);
  SOElement::SOElement(&local_540,(SField *)sfBalance,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_540);
  SOElement::SOElement(&local_550,(SField *)sfPublicKey,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_550);
  SOElement::SOElement(&local_560,(SField *)sfSettleDelay,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_560);
  SOElement::SOElement(&local_570,(SField *)sfExpiration,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_570);
  SOElement::SOElement(&local_580,(SField *)sfCancelAfter,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_580);
  SOElement::SOElement(&local_590,(SField *)sfSourceTag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_590);
  SOElement::SOElement(&local_5a0,(SField *)sfDestinationTag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_5a0);
  SOElement::SOElement(&local_5b0,(SField *)sfOwnerNode,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_5b0);
  SOElement::SOElement(&local_5c0,(SField *)sfPreviousTxnID,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_5c0);
  SOElement::SOElement(&local_5d0,(SField *)sfPreviousTxnLgrSeq,SOE_REQUIRED);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_5d0);
  return;
}

Assistant:

LedgerFormats::LedgerFormats ()
{
    add ("AccountRoot", ltACCOUNT_ROOT)
            << SOElement (sfAccount,             SOE_REQUIRED)
            << SOElement (sfSequence,            SOE_REQUIRED)
            << SOElement (sfBalance,             SOE_REQUIRED)
            << SOElement (sfOwnerCount,          SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            << SOElement (sfAccountTxnID,        SOE_OPTIONAL)
            << SOElement (sfRegularKey,          SOE_OPTIONAL)
            << SOElement (sfEmailHash,           SOE_OPTIONAL)
            << SOElement (sfWalletLocator,       SOE_OPTIONAL)
            << SOElement (sfWalletSize,          SOE_OPTIONAL)
            << SOElement (sfMessageKey,          SOE_OPTIONAL)
            << SOElement (sfTransferRate,        SOE_OPTIONAL)
            << SOElement (sfDomain,              SOE_OPTIONAL)
            << SOElement (sfTickSize,            SOE_OPTIONAL)
            ;

    add ("DirectoryNode", ltDIR_NODE)
            << SOElement (sfOwner,               SOE_OPTIONAL)  // for owner directories
            << SOElement (sfTakerPaysCurrency,   SOE_OPTIONAL)  // for order book directories
            << SOElement (sfTakerPaysIssuer,     SOE_OPTIONAL)  // for order book directories
            << SOElement (sfTakerGetsCurrency,   SOE_OPTIONAL)  // for order book directories
            << SOElement (sfTakerGetsIssuer,     SOE_OPTIONAL)  // for order book directories
            << SOElement (sfExchangeRate,        SOE_OPTIONAL)  // for order book directories
            << SOElement (sfIndexes,             SOE_REQUIRED)
            << SOElement (sfRootIndex,           SOE_REQUIRED)
            << SOElement (sfIndexNext,           SOE_OPTIONAL)
            << SOElement (sfIndexPrevious,       SOE_OPTIONAL)
            ;

    add ("Offer", ltOFFER)
            << SOElement (sfAccount,             SOE_REQUIRED)
            << SOElement (sfSequence,            SOE_REQUIRED)
            << SOElement (sfTakerPays,           SOE_REQUIRED)
            << SOElement (sfTakerGets,           SOE_REQUIRED)
            << SOElement (sfBookDirectory,       SOE_REQUIRED)
            << SOElement (sfBookNode,            SOE_REQUIRED)
            << SOElement (sfOwnerNode,           SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            << SOElement (sfExpiration,          SOE_OPTIONAL)
            ;

    add ("JbcoinState", ltJBCOIN_STATE)
            << SOElement (sfBalance,             SOE_REQUIRED)
            << SOElement (sfLowLimit,            SOE_REQUIRED)
            << SOElement (sfHighLimit,           SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            << SOElement (sfLowNode,             SOE_OPTIONAL)
            << SOElement (sfLowQualityIn,        SOE_OPTIONAL)
            << SOElement (sfLowQualityOut,       SOE_OPTIONAL)
            << SOElement (sfHighNode,            SOE_OPTIONAL)
            << SOElement (sfHighQualityIn,       SOE_OPTIONAL)
            << SOElement (sfHighQualityOut,      SOE_OPTIONAL)
            ;

    add ("Escrow", ltESCROW) <<
        SOElement (sfAccount,           SOE_REQUIRED) <<
        SOElement (sfDestination,       SOE_REQUIRED) <<
        SOElement (sfAmount,            SOE_REQUIRED) <<
        SOElement (sfCondition,         SOE_OPTIONAL) <<
        SOElement (sfCancelAfter,       SOE_OPTIONAL) <<
        SOElement (sfFinishAfter,       SOE_OPTIONAL) <<
        SOElement (sfSourceTag,         SOE_OPTIONAL) <<
        SOElement (sfDestinationTag,    SOE_OPTIONAL) <<
        SOElement (sfOwnerNode,         SOE_REQUIRED) <<
        SOElement (sfPreviousTxnID,     SOE_REQUIRED) <<
        SOElement (sfPreviousTxnLgrSeq, SOE_REQUIRED) <<
        SOElement (sfDestinationNode,   SOE_OPTIONAL);

    add ("LedgerHashes", ltLEDGER_HASHES)
            << SOElement (sfFirstLedgerSequence, SOE_OPTIONAL) // Remove if we do a ledger restart
            << SOElement (sfLastLedgerSequence,  SOE_OPTIONAL)
            << SOElement (sfHashes,              SOE_REQUIRED)
            ;

    add ("Amendments", ltAMENDMENTS)
            << SOElement (sfAmendments,          SOE_OPTIONAL) // Enabled
            << SOElement (sfMajorities,          SOE_OPTIONAL)
            ;

    add ("FeeSettings", ltFEE_SETTINGS)
            << SOElement (sfBaseFee,             SOE_REQUIRED)
            << SOElement (sfReferenceFeeUnits,   SOE_REQUIRED)
            << SOElement (sfReserveBase,         SOE_REQUIRED)
            << SOElement (sfReserveIncrement,    SOE_REQUIRED)
            ;

    add ("Ticket", ltTICKET)
            << SOElement (sfAccount,             SOE_REQUIRED)
            << SOElement (sfSequence,            SOE_REQUIRED)
            << SOElement (sfOwnerNode,           SOE_REQUIRED)
            << SOElement (sfTarget,              SOE_OPTIONAL)
            << SOElement (sfExpiration,          SOE_OPTIONAL)
            ;

    // All fields are SOE_REQUIRED because there is always a
    // SignerEntries.  If there are no SignerEntries the node is deleted.
    add ("SignerList", ltSIGNER_LIST)
            << SOElement (sfOwnerNode,           SOE_REQUIRED)
            << SOElement (sfSignerQuorum,        SOE_REQUIRED)
            << SOElement (sfSignerEntries,       SOE_REQUIRED)
            << SOElement (sfSignerListID,        SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            ;

    add ("PayChannel", ltPAYCHAN)
            << SOElement (sfAccount,           SOE_REQUIRED)
            << SOElement (sfDestination,       SOE_REQUIRED)
            << SOElement (sfAmount,            SOE_REQUIRED)
            << SOElement (sfBalance,           SOE_REQUIRED)
            << SOElement (sfPublicKey,         SOE_REQUIRED)
            << SOElement (sfSettleDelay,       SOE_REQUIRED)
            << SOElement (sfExpiration,        SOE_OPTIONAL)
            << SOElement (sfCancelAfter,       SOE_OPTIONAL)
            << SOElement (sfSourceTag,         SOE_OPTIONAL)
            << SOElement (sfDestinationTag,    SOE_OPTIONAL)
            << SOElement (sfOwnerNode,         SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,     SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq, SOE_REQUIRED)
            ;
}